

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O1

void composition_source_over(uint32_t *dest,int length,uint32_t *src,uint32_t const_alpha)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  if (const_alpha == 0xff) {
    if (0 < length) {
      uVar1 = 0;
      do {
        uVar2 = src[uVar1];
        if (uVar2 < 0xff000000) {
          if (uVar2 != 0) {
            uVar4 = (dest[uVar1] & 0xff00ff) * (~uVar2 >> 0x18);
            uVar3 = (dest[uVar1] >> 8 & 0xff00ff) * (~uVar2 >> 0x18);
            dest[uVar1] = (uVar3 + 0x800080 + (uVar3 >> 8 & 0xff00ff) & 0xff00ff00) + uVar2 +
                          (uVar4 + 0x800080 + (uVar4 >> 8 & 0xff00ff) >> 8 & 0xff00ff);
          }
        }
        else {
          dest[uVar1] = uVar2;
        }
        uVar1 = uVar1 + 1;
      } while ((uint)length != uVar1);
    }
  }
  else if (0 < length) {
    uVar1 = 0;
    do {
      uVar2 = (src[uVar1] & 0xff00ff) * const_alpha;
      uVar3 = (src[uVar1] >> 8 & 0xff00ff) * const_alpha;
      uVar4 = uVar3 + 0x800080 + (uVar3 >> 8 & 0xff00ff);
      uVar3 = ~uVar4 >> 0x18;
      uVar5 = (dest[uVar1] & 0xff00ff) * uVar3;
      uVar3 = (dest[uVar1] >> 8 & 0xff00ff) * uVar3;
      dest[uVar1] = (uVar3 + 0x800080 + (uVar3 >> 8 & 0xff00ff) & 0xff00ff00) +
                    (uVar4 & 0xff00ff00 | uVar2 + 0x800080 + (uVar2 >> 8 & 0xff00ff) >> 8 & 0xff00ff
                    ) + (uVar5 + 0x800080 + (uVar5 >> 8 & 0xff00ff) >> 8 & 0xff00ff);
      uVar1 = uVar1 + 1;
    } while ((uint)length != uVar1);
  }
  return;
}

Assistant:

static void composition_source_over(uint32_t* dest, int length, const uint32_t* src, uint32_t const_alpha)
{
    if(const_alpha == 255) {
        for(int i = 0; i < length; i++) {
            uint32_t s = src[i];
            if(s >= 0xff000000) {
                dest[i] = s;
            } else if (s != 0) {
                dest[i] = s + BYTE_MUL(dest[i], plutovg_alpha(~s));
            }
        }
    } else {
        for(int i = 0; i < length; i++) {
            uint32_t s = BYTE_MUL(src[i], const_alpha);
            dest[i] = s + BYTE_MUL(dest[i], plutovg_alpha(~s));
        }
    }
}